

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_CreateIntArray(int *numbers,int count)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  ulong uVar3;
  ulong uVar4;
  cJSON *pcVar5;
  
  pcVar1 = cJSON_CreateArray();
  if (pcVar1 != (cJSON *)0x0) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)count;
    if (count < 1) {
      uVar3 = uVar4;
    }
    pcVar5 = (cJSON *)0x0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pcVar2 = cJSON_CreateNumber((double)numbers[uVar4]);
      if (uVar4 == 0) {
        pcVar1->child = pcVar2;
      }
      else {
        pcVar5->next = pcVar2;
        pcVar2->prev = pcVar5;
      }
      pcVar5 = pcVar2;
    }
  }
  return pcVar1;
}

Assistant:

cJSON *cJSON_CreateIntArray(const int *numbers,int count)		{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateNumber(numbers[i]);if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}